

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase827::run(TestCase827 *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Builder builder;
  Builder builder_00;
  ClientHook *pCVar3;
  CapTableBuilder *pCVar4;
  RequestHook *pRVar5;
  TransformPromiseNodeBase *this_00;
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  Reader value;
  Client client;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_test_c__:839:38),_capnp::Response<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes>::Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::CallResults>_>
  promise;
  WaitScope waitScope;
  Request<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Inner2<capnp::Text>,_capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::CallResults>
  request;
  EventLoop loop;
  undefined1 local_2a8 [8];
  Client local_2a0;
  PointerBuilder local_290;
  WaitScope local_278;
  Request<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Inner2<capnp::Text>,_capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::CallResults>
  local_268;
  StructBuilder local_230;
  StructBuilder local_208;
  bool bVar6;
  undefined7 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe40;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  EventLoop local_78;
  Maybe<capnp::MessageSize> local_40;
  
  kj::EventLoop::EventLoop(&local_78);
  local_278.busyPollInterval = 0xffffffff;
  local_278.loop = &local_78;
  kj::EventLoop::enterScope(&local_78);
  Capability::Client::Client(&local_2a0,(void *)0x0);
  local_2a8 = (undefined1  [8])
              &capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::
               TestAllTypes,capnp::AnyPointer>::Interface<capnp::List<unsigned_int,(capnp::Kind)::
               typeinfo;
  local_40.ptr.isSet = false;
  capnproto_test::capnp::test::
  TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::
  Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::Client::callRequest
            (&local_268,(Client *)local_2a8,&local_40);
  uVar9 = local_268.super_Builder._builder.pointers + 1;
  bVar6 = SUB81(local_268.super_Builder._builder.segment,0);
  uVar7 = (undefined7)((ulong)local_268.super_Builder._builder.segment >> 8);
  value.super_StringPtr.content.size_ = 6;
  value.super_StringPtr.content.ptr = "hello";
  uVar8 = local_268.super_Builder._builder.capTable;
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&stack0xfffffffffffffe20,value);
  local_290.pointer = local_268.super_Builder._builder.pointers + 2;
  local_290.segment = local_268.super_Builder._builder.segment;
  local_290.capTable = local_268.super_Builder._builder.capTable;
  PointerBuilder::initStruct
            ((StructBuilder *)&stack0xfffffffffffffe20,&local_290,(StructSize)0x20000);
  local_290.segment = (SegmentBuilder *)CONCAT71(uVar7,bVar6);
  PointerBuilder::initStruct(&local_208,&local_290,(StructSize)0x140006);
  builder._builder.segment._1_7_ = uVar7;
  builder._builder.segment._0_1_ = bVar6;
  builder._builder.capTable = (CapTableBuilder *)uVar8;
  builder._builder.data = (void *)uVar9;
  builder._builder.pointers = (WirePointer *)in_stack_fffffffffffffe38;
  builder._builder._32_8_ = in_stack_fffffffffffffe40;
  initTestMessage(builder);
  local_290.pointer = local_268.super_Builder._builder.pointers + 3;
  local_290.segment = local_268.super_Builder._builder.segment;
  local_290.capTable = local_268.super_Builder._builder.capTable;
  PointerBuilder::initStruct
            ((StructBuilder *)&stack0xfffffffffffffe20,&local_290,(StructSize)0x20000);
  local_290.segment = (SegmentBuilder *)CONCAT71(uVar7,bVar6);
  PointerBuilder::initStruct(&local_230,&local_290,(StructSize)0x140006);
  builder_00._builder.segment._1_7_ = uVar7;
  builder_00._builder.segment._0_1_ = bVar6;
  builder_00._builder.capTable = (CapTableBuilder *)uVar8;
  builder_00._builder.data = (void *)uVar9;
  builder_00._builder.pointers = (WirePointer *)in_stack_fffffffffffffe38;
  builder_00._builder._32_8_ = in_stack_fffffffffffffe40;
  initTestMessage(builder_00);
  Request<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Inner2<capnp::Text>,_capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::CallResults>
  ::send((Request<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Inner2<capnp::Text>,_capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::CallResults>
          *)&stack0xfffffffffffffe20,(int)&local_268,__buf,in_RCX,in_R8D);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x28);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,(Own<kj::_::PromiseNode> *)&stack0xfffffffffffffe20,
             kj::_::
             TransformPromiseNode<kj::_::Void,_capnp::Response<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::CallResults>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++:839:38),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++:844:6)>
             ::anon_class_1_0_00000001_for_func::operator());
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0062c390;
  local_290.segment =
       (SegmentBuilder *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,capnp::Response<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,capnp::AnyPointer>::Interface<capnp::List<unsigned_int,(capnp::Kind)0>>::CallResults>,capnp::_::(anonymous_namespace)::TestCase827::run()::$_0,capnp::_::(anonymous_namespace)::TestCase827::run()::$_1>>
        ::instance;
  local_290.capTable = (CapTableBuilder *)this_00;
  if ((char *)in_stack_fffffffffffffe40 != (char *)0x0) {
    (***(_func_int ***)local_1b0)
              (local_1b0,in_stack_fffffffffffffe40,8,uStack_1b8,uStack_1b8,0,local_230.segment,
               local_230.capTable,local_230.data,local_230.pointers,local_230._32_8_);
  }
  if ((WirePointer *)in_stack_fffffffffffffe38 != (WirePointer *)0x0) {
    (**(code **)*(WirePointer *)uVar9)
              (uVar9,(long)&((WireValue<uint32_t>_conflict *)
                            &((ArrayDisposer *)in_stack_fffffffffffffe38)->_vptr_ArrayDisposer)->
                            value +
                     *(long *)(*(long *)&((ArrayDisposer *)in_stack_fffffffffffffe38)->
                                         _vptr_ArrayDisposer + -0x10));
  }
  uVar9 = uVar8;
  if ((CapTableReader *)uVar8 != (CapTableReader *)0x0) {
    uVar9 = (CapTableReader *)0x0;
    (*(code *)**(undefined8 **)CONCAT71(uVar7,bVar6))
              ((undefined8 *)CONCAT71(uVar7,bVar6),
               (char *)(uVar8 + (long)(*(_func_int ***)uVar8)[-2]));
  }
  bVar6 = false;
  kj::_::waitImpl((Own<kj::_::PromiseNode> *)&local_290,(ExceptionOrValue *)&stack0xfffffffffffffe20
                  ,&local_278);
  if (bVar6 != false) {
    kj::throwRecoverableException((Exception *)&stack0xfffffffffffffe28,0);
    if (bVar6 == true) {
      kj::Exception::~Exception((Exception *)&stack0xfffffffffffffe28);
    }
    (**(code **)(**(long **)(*(pointer_____offset_0x10___ *)((long)local_2a8 + -0x18) +
                            (long)&local_2a0.hook) + 0x20))(&stack0xfffffffffffffe20);
    puVar1 = (undefined8 *)CONCAT71(uVar7,bVar6);
    uVar8 = uVar9;
    (**(code **)(**(long **)(*(pointer_____offset_0x10___ *)((long)local_2a8 + -0x18) +
                            (long)&local_2a0.hook) + 0x20))();
    puVar2 = (undefined8 *)CONCAT71(uVar7,bVar6);
    uVar10 = uVar8;
    (**(code **)(**(long **)(*(pointer_____offset_0x10___ *)((long)local_2a8 + -0x18) +
                            (long)&local_2a0.hook) + 0x20))();
    if ((CapTableBuilder *)uVar10 != (CapTableBuilder *)0x0) {
      (*(code *)**(undefined8 **)CONCAT71(uVar7,bVar6))
                ((undefined8 *)CONCAT71(uVar7,bVar6),
                 (char *)(uVar10 + *(long *)((long)*(CapTableReader *)uVar10 + -0x10)));
    }
    if ((CapTableReader *)uVar8 != (CapTableReader *)0x0) {
      (**(code **)*puVar2)(puVar2,(char *)(uVar8 + (long)(*(_func_int ***)uVar8)[-2]));
    }
    if ((CapTableReader *)uVar9 != (CapTableReader *)0x0) {
      (**(code **)*puVar1)(puVar1,(char *)(uVar9 + (long)(*(_func_int ***)uVar9)[-2]));
    }
    pCVar4 = local_290.capTable;
    if ((TransformPromiseNodeBase *)local_290.capTable != (TransformPromiseNodeBase *)0x0) {
      local_290.capTable = (CapTableBuilder *)0x0;
      (*(code *)(((local_290.segment)->super_SegmentReader).arena)->_vptr_Arena)
                (local_290.segment,
                 ((PromiseNode *)&pCVar4->super_CapTableReader)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pCVar4->super_CapTableReader)->_vptr_PromiseNode);
    }
    pRVar5 = local_268.hook.ptr;
    if (local_268.hook.ptr != (RequestHook *)0x0) {
      local_268.hook.ptr = (RequestHook *)0x0;
      (**(local_268.hook.disposer)->_vptr_Disposer)
                (local_268.hook.disposer,
                 pRVar5->_vptr_RequestHook[-2] + (long)&pRVar5->_vptr_RequestHook);
    }
    pCVar3 = local_2a0.hook.ptr;
    if (local_2a0.hook.ptr != (ClientHook *)0x0) {
      local_2a0.hook.ptr = (ClientHook *)0x0;
      (**(local_2a0.hook.disposer)->_vptr_Disposer)
                (local_2a0.hook.disposer,
                 pCVar3->_vptr_ClientHook[-2] + (long)&pCVar3->_vptr_ClientHook);
    }
    kj::EventLoop::leaveScope(local_278.loop);
    kj::EventLoop::~EventLoop(&local_78);
    return;
  }
  kj::_::unreachable();
}

Assistant:

TEST(Capability, Generics) {
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  typedef test::TestGenerics<TestAllTypes>::Interface<List<uint32_t>> Interface;
  Interface::Client client = nullptr;

  auto request = client.callRequest();
  request.setBaz("hello");
  initTestMessage(request.initInnerBound().initFoo());
  initTestMessage(request.initInnerUnbound().getFoo().initAs<TestAllTypes>());

  auto promise = request.send().then([](capnp::Response<Interface::CallResults>&& response) {
    // This doesn't actually execute; we're just checking that it compiles.
    List<uint32_t>::Reader qux = response.getQux();
    qux.size();
    checkTestMessage(response.getGen().getFoo());
  }, [](kj::Exception&& e) {
    // Ignore exception (which we'll always get because we're calling a null capability).
  });

  promise.wait(waitScope);

  // Check that asGeneric<>() compiles.
  test::TestGenerics<TestAllTypes>::Interface<>::Client castClient = client.asGeneric<>();
  test::TestGenerics<TestAllTypes>::Interface<TestAllTypes>::Client castClient2 =
      client.asGeneric<TestAllTypes>();
  test::TestGenerics<>::Interface<List<uint32_t>>::Client castClient3 = client.asTestGenericsGeneric<>();
}